

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VaryingBlockLocationsTest::getPassSnippet_abi_cxx11_
          (string *__return_storage_ptr__,VaryingBlockLocationsTest *this,GLuint param_1,
          VaryingPassthrough *varying_passthrough,STAGES stage)

{
  string local_50;
  undefined1 local_2d;
  STAGES local_2c;
  VaryingPassthrough *pVStack_28;
  STAGES stage_local;
  VaryingPassthrough *varying_passthrough_local;
  VaryingBlockLocationsTest *pVStack_18;
  GLuint param_1_local;
  VaryingBlockLocationsTest *this_local;
  string *result;
  
  local_2d = 0;
  local_2c = stage;
  pVStack_28 = varying_passthrough;
  varying_passthrough_local._4_4_ = param_1;
  pVStack_18 = this;
  this_local = (VaryingBlockLocationsTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_2c == VERTEX) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "vs_tcs_block.third  = vs_in_third;\n    vs_tcs_block.fourth = vs_in_fourth;\n    vs_tcs_block.fifth  = vs_in_fifth;\n"
              );
  }
  else {
    TextureTestBase::getPassSnippet_abi_cxx11_
              (&local_50,&this->super_TextureTestBase,0,pVStack_28,local_2c);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingBlockLocationsTest::getPassSnippet(GLuint /* test_case_index */,
													  Utils::VaryingPassthrough& varying_passthrough,
													  Utils::Shader::STAGES		 stage)
{
	std::string result;

	if (Utils::Shader::VERTEX != stage)
	{
		result = TextureTestBase::getPassSnippet(0, varying_passthrough, stage);
	}
	else
	{
		result = "vs_tcs_block.third  = vs_in_third;\n"
				 "    vs_tcs_block.fourth = vs_in_fourth;\n"
				 "    vs_tcs_block.fifth  = vs_in_fifth;\n";
	}

	return result;
}